

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.c
# Opt level: O1

void handler(int max,int argc,Edge *allEdges)

{
  long lVar1;
  long lVar2;
  int iVar3;
  ulong in_RCX;
  long extraout_RDX;
  ulong uVar4;
  int iVar5;
  Solution *pSVar6;
  undefined4 in_register_0000003c;
  Solution *pSVar7;
  Solution *unaff_R12;
  byte bVar8;
  Solution my_solution;
  undefined8 uStack_f8;
  Solution *pSStack_f0;
  Edge *pEStack_e8;
  Solution *pSStack_e0;
  Solution local_b0;
  Solution local_6c;
  
  pSVar7 = (Solution *)CONCAT44(in_register_0000003c,max);
  bVar8 = 0;
  iVar5 = argc;
  iVar3 = get_state();
  if (0 < iVar3) {
    unaff_R12 = &local_b0;
    do {
      calculate_one_solution(&local_6c,argc,allEdges,max);
      pSVar6 = &local_6c;
      pSVar7 = unaff_R12;
      for (in_RCX = 0x11; in_RCX != 0; in_RCX = in_RCX - 1) {
        pSVar7->edges[0].start = pSVar6->edges[0].start;
        pSVar6 = (Solution *)((long)pSVar6 + (ulong)bVar8 * -8 + 4);
        pSVar7 = (Solution *)((long)pSVar7 + (ulong)bVar8 * -8 + 4);
      }
      if (-1 < local_b0.amount) {
        pSVar7 = unaff_R12;
        iVar3 = circ_buf_write(unaff_R12);
        iVar5 = (int)pSVar6;
        if (iVar3 != 0) {
          handler_cold_1();
          goto LAB_00101648;
        }
      }
      iVar5 = (int)pSVar6;
      iVar3 = get_state();
    } while (0 < iVar3);
  }
  if (iVar3 == 0) {
    return;
  }
LAB_00101648:
  handler_cold_2();
  pSStack_e0 = unaff_R12;
  pEStack_e8 = allEdges;
  pSStack_f0 = pSVar7;
  lVar1 = -((in_RCX & 0xffffffff) * 4 + 0xf & 0xfffffffffffffff0);
  lVar2 = lVar1 + -0xf0;
  if (0 < (int)in_RCX) {
    uVar4 = 0;
    do {
      *(undefined8 *)((long)&uStack_f8 + lVar1) = 0x101688;
      iVar3 = rand();
      *(int *)((long)&pSStack_f0 + uVar4 * 4 + lVar2 + 0xf0) = iVar3 % 3 + 1;
      uVar4 = uVar4 + 1;
    } while ((in_RCX & 0xffffffff) != uVar4);
  }
  iVar3 = 0;
  if (1 < iVar5) {
    uVar4 = 0;
    iVar3 = 0;
    do {
      if (*(int *)((long)&pSStack_f0 + (long)*(int *)(extraout_RDX + uVar4 * 8) * 4 + lVar2 + 0xf0)
          == *(int *)((long)&pSStack_f0 +
                     (long)*(int *)(extraout_RDX + 4 + uVar4 * 8) * 4 + lVar2 + 0xf0)) {
        if (7 < iVar3) {
          iVar3 = -1;
          break;
        }
        pSStack_f0->edges[iVar3] = *(Edge *)(extraout_RDX + uVar4 * 8);
        iVar3 = iVar3 + 1;
      }
      uVar4 = uVar4 + 1;
    } while (iVar5 - 1 != uVar4);
  }
  pSStack_f0->amount = iVar3;
  return;
}

Assistant:

static void handler(const int max, const int argc, const Edge *allEdges)
{
	Solution my_solution;

	int state;
	while ((state = get_state()) > 0)
	{

		my_solution = calculate_one_solution(argc, allEdges, max);

		if (my_solution.amount < 0)
		{
#ifdef DEBUG
			fprintf(stdout, "Solution too Big\n");
#endif 
		}
		else
		{
#ifdef DEBUG
			printEdge(my_solution.edges, my_solution.amount);
#endif
			if (circ_buf_write(&my_solution) != 0)
			{
				ERROR_EXIT("error writing to shared memory");
			}
		}
	}
	if (state != 0)
	{
		ERROR_EXIT("couldn't fetch program state");
	}
}